

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O1

int sys_open_absolute(char *name,char *ext,char *dirresult,char **nameresult,uint size,int bin,
                     int *fdp)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  char dirbuf [1000];
  int in_stack_fffffffffffffbd8;
  char local_418 [1000];
  
  if ((*name == '~') || (iVar1 = 0, *name == '/')) {
    pcVar2 = strrchr(name,0x2f);
    if (pcVar2 == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = (int)pcVar2 - (int)name;
      if (0x3e6 < iVar1) {
        iVar1 = 999;
      }
      __n = (size_t)iVar1;
      strncpy(local_418,name,__n);
      local_418[__n] = '\0';
      iVar1 = sys_trytoopenone(local_418,name + __n + 1,ext,dirresult,nameresult,size,
                               in_stack_fffffffffffffbd8);
      *fdp = iVar1;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int sys_open_absolute(const char *name, const char* ext,
    char *dirresult, char **nameresult, unsigned int size, int bin, int *fdp)
{
    if (sys_isabsolutepath(name))
    {
        char dirbuf[MAXPDSTRING], *z = strrchr(name, '/');
        int dirlen;
        if (!z)
            return (0);
        dirlen = (int)(z - name);
        if (dirlen > MAXPDSTRING-1)
            dirlen = MAXPDSTRING-1;
        strncpy(dirbuf, name, dirlen);
        dirbuf[dirlen] = 0;
        *fdp = sys_trytoopenone(dirbuf, name+(dirlen+1), ext,
            dirresult, nameresult, size, bin);
        return (1);
    }
    else return (0);
}